

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeleteMessage.cpp
# Opt level: O0

bool __thiscall DeleteMessage::fillMe(DeleteMessage *this,string *message)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  char *pcVar4;
  string *message_local;
  DeleteMessage *this_local;
  
  if (this->parameter_count == 0) {
    uVar3 = std::__cxx11::string::length();
    if ((uVar3 < 10) && (lVar2 = std::__cxx11::string::length(), lVar2 != 0)) {
      this->parameter_count = this->parameter_count + 1;
      std::__cxx11::string::operator=((string *)&this->username,(string *)message);
      std::__cxx11::string::pop_back();
      std::__cxx11::string::operator=
                ((string *)&(this->super_ServerOperation).statusMessage,"Message-number:");
      return true;
    }
    std::__cxx11::string::operator=
              ((string *)&(this->super_ServerOperation).statusMessage,
               "invalid username - Max 8 Characters!");
  }
  else if (this->parameter_count == 1) {
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)message);
      iVar1 = isdigit((int)*pcVar4);
      if ((iVar1 != 0) &&
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)message), *pcVar4 != '0')) {
        iVar1 = std::__cxx11::stoi(message,(size_t *)0x0,10);
        this->chosen_message = iVar1;
        std::__cxx11::string::operator=
                  ((string *)&(this->super_ServerOperation).statusMessage,
                   (this->super_ServerOperation).EXECUTEPENDING);
        return false;
      }
    }
    std::__cxx11::string::operator=
              ((string *)&(this->super_ServerOperation).statusMessage,
               "Invalid Message-Number - Must be a number bigger than 0!");
  }
  else {
    std::__cxx11::string::operator=
              ((string *)&(this->super_ServerOperation).statusMessage,
               "Fatal Error! Parameter is not set! Connection closed");
  }
  return false;
}

Assistant:

bool DeleteMessage::fillMe(string message) {
    //fill the needed parameter

    switch(parameter_count){
        case 0:
            ///first parameter, check if valid input for a userdirectory
            if(message.length() <= 9 && message.length() > 0){
                parameter_count ++;
                username = message;
                username.pop_back();
                ///give user the information to next input, if everything went well
                statusMessage = "Message-number:";
                return true;
            }else {
                ///if invalid input, send the information to the client and return false
                statusMessage = "invalid username - Max 8 Characters!";
                return false;
            }
        case 1:
            ///check if second input is valid, if yes save the messagenumber.
            if(!message.empty() && isdigit(message[0]) && message[0] != '0'){
                chosen_message = stoi(message);
                ///change status to "ready for execute"
                statusMessage = EXECUTEPENDING;
                return false;
            }else{
                statusMessage = "Invalid Message-Number - Must be a number bigger than 0!";
                return false;
            }
        default:
            ///shouldn't be called anyway - if there is. return false and break this function.
            statusMessage = "Fatal Error! Parameter is not set! Connection closed";
            return false;
    }
}